

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Void * __thiscall
kj::_::NullableValue<kj::_::Void>::emplace<kj::_::Void>
          (NullableValue<kj::_::Void> *this,Void *params)

{
  Void *params_00;
  Void *params_local;
  NullableValue<kj::_::Void> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::_::Void>((Void *)&this->field_0x1);
  }
  params_00 = fwd<kj::_::Void>(params);
  ctor<kj::_::Void,kj::_::Void>((Void *)&this->field_0x1,params_00);
  this->isSet = true;
  return (Void *)&this->field_0x1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }